

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoolSimp.cpp
# Opt level: O0

bool __thiscall Inferences::BoolSimp::areComplements(BoolSimp *this,TermList t1,TermList t2)

{
  bool bVar1;
  int iVar2;
  Proxy PVar3;
  Term *pTVar4;
  TermList *pTVar5;
  uint64_t in_RDX;
  TermList head;
  Symbol *sym;
  uint in_stack_ffffffffffffff9c;
  Signature *in_stack_ffffffffffffffa0;
  Signature *this_00;
  Signature *in_stack_ffffffffffffffa8;
  TermList in_stack_ffffffffffffffb0;
  TermList local_40 [3];
  Symbol *local_28;
  TermList local_18;
  TermList local_10 [2];
  
  local_18._content = in_RDX;
  if ((areComplements(Kernel::TermList,Kernel::TermList)::args == '\0') &&
     (iVar2 = __cxa_guard_acquire(&areComplements(Kernel::TermList,Kernel::TermList)::args),
     iVar2 != 0)) {
    Lib::Stack<Kernel::TermList>::Stack
              ((Stack<Kernel::TermList> *)in_stack_ffffffffffffffb0._content,
               (size_t)in_stack_ffffffffffffffa8);
    __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&areComplements::args,&__dso_handle);
    __cxa_guard_release(&areComplements(Kernel::TermList,Kernel::TermList)::args);
  }
  Kernel::TermList::TermList(local_40);
  ApplicativeHelper::getHeadAndArgs
            (in_stack_ffffffffffffffb0,(TermList *)in_stack_ffffffffffffffa8,
             &in_stack_ffffffffffffffa0->_dividesNvalues);
  bVar1 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffffa0);
  if (!bVar1) {
    in_stack_ffffffffffffffa8 = DAT_01333830;
    pTVar4 = Kernel::TermList::term((TermList *)0x78055b);
    Kernel::Term::functor(pTVar4);
    local_28 = Kernel::Signature::getFunction(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    PVar3 = Kernel::Signature::Symbol::proxy(local_28);
    if (PVar3 == NOT) {
      pTVar5 = Lib::Stack<Kernel::TermList>::operator[](&areComplements::args,0);
      bVar1 = Kernel::TermList::operator==(pTVar5,&local_18);
      if (bVar1) {
        return true;
      }
    }
  }
  ApplicativeHelper::getHeadAndArgs
            (local_18,(TermList *)in_stack_ffffffffffffffa8,
             &in_stack_ffffffffffffffa0->_dividesNvalues);
  bVar1 = Kernel::TermList::isVar((TermList *)in_stack_ffffffffffffffa0);
  if (!bVar1) {
    this_00 = DAT_01333830;
    pTVar4 = Kernel::TermList::term((TermList *)0x78061b);
    Kernel::Term::functor(pTVar4);
    local_28 = Kernel::Signature::getFunction(this_00,in_stack_ffffffffffffff9c);
    PVar3 = Kernel::Signature::Symbol::proxy(local_28);
    if (PVar3 == NOT) {
      pTVar5 = Lib::Stack<Kernel::TermList>::operator[](&areComplements::args,0);
      bVar1 = Kernel::TermList::operator==(pTVar5,local_10);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool BoolSimp::areComplements(TermList t1, TermList t2){
  Signature::Symbol* sym;
  static TermStack args;
  TermList head;

  ApplicativeHelper::getHeadAndArgs(t1, head, args);
  if(!head.isVar()){
    sym = env.signature->getFunction(head.term()->functor());
    if(sym->proxy() == Signature::NOT){
      ASS(args.size() == 1);
      if(args[0] == t2){ return true;}
    }
  }

  ApplicativeHelper::getHeadAndArgs(t2, head, args);
  if(!head.isVar()){
    sym = env.signature->getFunction(head.term()->functor());
    if(sym->proxy() == Signature::NOT){
      ASS(args.size() == 1);
      if(args[0] == t1){ return true;}
    }
  }

  return false;
}